

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayerProvokingVertexQueryCase::iterate
          (LayerProvokingVertexQueryCase *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  GLint *pGVar6;
  Enum<int,_2UL> EVar7;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  ScopedLogSection local_428;
  ScopedLogSection section;
  string local_418;
  MessageBuilder local_3f8;
  GetNameFunc local_278;
  int local_270;
  Enum<int,_2UL> local_268;
  MessageBuilder local_258;
  undefined1 local_d8 [8];
  QueriedState state;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  LayerProvokingVertexQueryCase *this_local;
  
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar2),pTVar4);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar4,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  deqp::gls::StateQueryUtil::QueriedState::QueriedState((QueriedState *)local_d8);
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  deqp::gls::StateQueryUtil::queryState
            ((ResultCollector *)local_78,this_00,QUERY_INTEGER,0x825e,(QueriedState *)local_d8);
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined((QueriedState *)local_d8);
  if (!bVar1) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_258,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_258,(char (*) [26])0x2bf2c88);
    pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
    EVar7 = glu::getProvokingVertexStr(*pGVar6);
    local_278 = EVar7.m_getName;
    local_270 = EVar7.m_value;
    local_268.m_getName = local_278;
    local_268.m_value = local_270;
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_268);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_258);
    pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
    if (*pGVar6 != 0x8e4d) {
      pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
      if (*pGVar6 != 0x8e4e) {
        pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
        if (*pGVar6 != 0x8260) {
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3f8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_3f8,
                              (char (*) [67])
                              "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got ");
          pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pGVar6);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [85])
                                     "Expected any of {FIRST_VERTEX_CONVENTION, LAST_VERTEX_CONVENTION, UNDEFINED_VERTEX}."
                             );
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3f8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_418,"got unexpected provoking vertex value",
                     (allocator<char> *)((long)&section.m_log + 7));
          tcu::ResultCollector::fail((ResultCollector *)local_78,&local_418);
          std::__cxx11::string::~string((string *)&local_418);
          std::allocator<char>::~allocator((allocator<char> *)((long)&section.m_log + 7));
        }
      }
    }
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"Types",&local_449);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_470,"Alternative queries",&local_471);
    tcu::ScopedLogSection::ScopedLogSection(&local_428,pTVar4,&local_448,&local_470);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_471);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
    deqp::gls::StateQueryUtil::verifyStateInteger
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x825e,*pGVar6,QUERY_BOOLEAN);
    pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
    deqp::gls::StateQueryUtil::verifyStateInteger
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x825e,*pGVar6,QUERY_INTEGER64);
    pGVar6 = deqp::gls::StateQueryUtil::QueriedState::getIntAccess((QueriedState *)local_d8);
    deqp::gls::StateQueryUtil::verifyStateInteger
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x825e,*pGVar6,QUERY_FLOAT);
    tcu::ScopedLogSection::~ScopedLogSection(&local_428);
  }
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

LayerProvokingVertexQueryCase::IterateResult LayerProvokingVertexQueryCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	QueriedState			state;

	gl.enableLogging(true);
	queryState(result, gl, QUERY_INTEGER, GL_LAYER_PROVOKING_VERTEX, state);

	if (!state.isUndefined())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "LAYER_PROVOKING_VERTEX = " << glu::getProvokingVertexStr(state.getIntAccess()) << tcu::TestLog::EndMessage;

		if (state.getIntAccess() != GL_FIRST_VERTEX_CONVENTION &&
			state.getIntAccess() != GL_LAST_VERTEX_CONVENTION &&
			state.getIntAccess() != GL_UNDEFINED_VERTEX)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got "
				<< state.getIntAccess() << "\n"
				<< "Expected any of {FIRST_VERTEX_CONVENTION, LAST_VERTEX_CONVENTION, UNDEFINED_VERTEX}."
				<< tcu::TestLog::EndMessage;

			result.fail("got unexpected provoking vertex value");
		}

		{
			const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Types", "Alternative queries");
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_BOOLEAN);
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_INTEGER64);
			verifyStateInteger(result, gl, GL_LAYER_PROVOKING_VERTEX, state.getIntAccess(), QUERY_FLOAT);
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}